

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_ls.c
# Opt level: O0

int KINSetLinearSolver(void *kinmem,SUNLinearSolver LS,SUNMatrix A)

{
  int iVar1;
  KINLsMem kinls_mem_00;
  SUNMatrix in_RDX;
  SUNLinearSolver in_RSI;
  KINMem in_RDI;
  int matrixbased;
  int iterative;
  int LSType;
  int retval;
  KINLsMem kinls_mem;
  KINMem kin_mem;
  int local_4;
  
  if (in_RDI == (KINMem)0x0) {
    KINProcessError((KINMem)0x0,-1,0x36,"KINSetLinearSolver",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_ls.c"
                    ,"KINSOL memory is NULL.");
    local_4 = -1;
  }
  else if (in_RSI == (SUNLinearSolver)0x0) {
    KINProcessError((KINMem)0x0,-3,0x3c,"KINSetLinearSolver",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_ls.c"
                    ,"LS must be non-NULL");
    local_4 = -3;
  }
  else if ((in_RSI->ops->gettype == (_func_SUNLinearSolver_Type_SUNLinearSolver *)0x0) ||
          (in_RSI->ops->solve ==
           (_func_int_SUNLinearSolver_SUNMatrix_N_Vector_N_Vector_sunrealtype *)0x0)) {
    KINProcessError(in_RDI,-3,0x45,"KINSetLinearSolver",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_ls.c"
                    ,"LS object is missing a required operation");
    local_4 = -3;
  }
  else {
    iVar1 = SUNLinSolGetType(in_RSI);
    if (iVar1 == 3) {
      KINProcessError(in_RDI,-3,0x50,"KINSetLinearSolver",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_ls.c"
                      ,"KINSOL is incompatible with MATRIX_EMBEDDED LS objects");
      local_4 = -3;
    }
    else if ((in_RDI->kin_vtemp1->ops->nvconst == (_func_void_sunrealtype_N_Vector *)0x0) ||
            (in_RDI->kin_vtemp1->ops->nvdotprod == (_func_sunrealtype_N_Vector_N_Vector *)0x0)) {
      KINProcessError(in_RDI,-3,0x5d,"KINSetLinearSolver",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_ls.c"
                      ,"A required vector operation is not implemented.");
      local_4 = -3;
    }
    else {
      if ((iVar1 != 0) == 0) {
        if (in_RDX == (SUNMatrix)0x0) {
          KINProcessError(in_RDI,-3,0x7d,"KINSetLinearSolver",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_ls.c"
                          ,"Incompatible inputs: direct LS requires non-NULL matrix");
          return -3;
        }
      }
      else {
        if ((in_RSI->ops->setscalingvectors ==
             (_func_SUNErrCode_SUNLinearSolver_N_Vector_N_Vector *)0x0) &&
           (in_RDI->kin_vtemp1->ops->nvgetlength == (_func_sunindextype_N_Vector *)0x0)) {
          KINProcessError(in_RDI,-3,0x68,"KINSetLinearSolver",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_ls.c"
                          ,"A required vector operation is not implemented.");
          return -3;
        }
        if ((iVar1 == 1) &&
           (in_RSI->ops->setatimes == (_func_SUNErrCode_SUNLinearSolver_void_ptr_SUNATimesFn *)0x0))
        {
          KINProcessError(in_RDI,-3,0x6f,"KINSetLinearSolver",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_ls.c"
                          ,"Incompatible inputs: iterative LS must support ATimes routine");
          return -3;
        }
        if ((iVar1 != 1) && (in_RDX == (SUNMatrix)0x0)) {
          KINProcessError(in_RDI,-3,0x76,"KINSetLinearSolver",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_ls.c"
                          ,"Incompatible inputs: matrix-iterative LS requires non-NULL matrix");
          return -3;
        }
      }
      if (in_RDI->kin_lfree != (_func_int_KINMemRec_ptr *)0x0) {
        (*in_RDI->kin_lfree)(in_RDI);
      }
      in_RDI->kin_inexact_ls = (uint)(iVar1 != 0);
      in_RDI->kin_linit = kinLsInitialize;
      in_RDI->kin_lsetup = kinLsSetup;
      in_RDI->kin_lsolve = kinLsSolve;
      in_RDI->kin_lfree = kinLsFree;
      kinls_mem_00 = (KINLsMem)malloc(0xb8);
      if (kinls_mem_00 == (KINLsMem)0x0) {
        KINProcessError(in_RDI,-4,0x93,"KINSetLinearSolver",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_ls.c"
                        ,"A memory request failed.");
        local_4 = -4;
      }
      else {
        memset(kinls_mem_00,0,0xb8);
        kinls_mem_00->LS = in_RSI;
        if (in_RDX == (SUNMatrix)0x0) {
          kinls_mem_00->jacDQ = 0;
          kinls_mem_00->jac = (KINLsJacFn)0x0;
          kinls_mem_00->J_data = (void *)0x0;
        }
        else {
          kinls_mem_00->jacDQ = 1;
          kinls_mem_00->jac = kinLsDQJac;
          kinls_mem_00->J_data = in_RDI;
        }
        kinls_mem_00->jtimesDQ = 1;
        kinls_mem_00->jtimes = kinLsDQJtimes;
        kinls_mem_00->jt_func = in_RDI->kin_func;
        kinls_mem_00->jt_data = in_RDI;
        kinls_mem_00->pset = (KINLsPrecSetupFn)0x0;
        kinls_mem_00->psolve = (KINLsPrecSolveFn)0x0;
        kinls_mem_00->pfree = (_func_int_KINMem *)0x0;
        kinls_mem_00->pdata = in_RDI->kin_user_data;
        kinLsInitializeCounters(kinls_mem_00);
        kinls_mem_00->last_flag = 0;
        if ((in_RSI->ops->setatimes == (_func_SUNErrCode_SUNLinearSolver_void_ptr_SUNATimesFn *)0x0)
           || (iVar1 = SUNLinSolSetATimes(in_RSI,in_RDI,kinLsATimes), iVar1 == 0)) {
          if ((in_RSI->ops->setpreconditioner ==
               (_func_SUNErrCode_SUNLinearSolver_void_ptr_SUNPSetupFn_SUNPSolveFn *)0x0) ||
             (iVar1 = SUNLinSolSetPreconditioner(in_RSI,in_RDI,0), iVar1 == 0)) {
            kinls_mem_00->tol_fac = (sunrealtype)&DAT_bff0000000000000;
            kinls_mem_00->J = in_RDX;
            in_RDI->kin_lmem = kinls_mem_00;
            local_4 = 0;
          }
          else {
            KINProcessError(in_RDI,-8,0xce,"KINSetLinearSolver",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_ls.c"
                            ,"Error in calling SUNLinSolSetPreconditioner");
            free(kinls_mem_00);
            local_4 = -8;
          }
        }
        else {
          KINProcessError(in_RDI,-8,0xc0,"KINSetLinearSolver",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_ls.c"
                          ,"Error in calling SUNLinSolSetATimes");
          free(kinls_mem_00);
          local_4 = -8;
        }
      }
    }
  }
  return local_4;
}

Assistant:

int KINSetLinearSolver(void* kinmem, SUNLinearSolver LS, SUNMatrix A)
{
  KINMem kin_mem;
  KINLsMem kinls_mem;
  int retval, LSType;
  sunbooleantype iterative;   /* is the solver iterative?    */
  sunbooleantype matrixbased; /* is a matrix structure used? */

  /* Return immediately if either kinmem or LS inputs are NULL */
  if (kinmem == NULL)
  {
    KINProcessError(NULL, KINLS_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_LS_KINMEM_NULL);
    return (KINLS_MEM_NULL);
  }
  if (LS == NULL)
  {
    KINProcessError(NULL, KINLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "LS must be non-NULL");
    return (KINLS_ILL_INPUT);
  }
  kin_mem = (KINMem)kinmem;

  /* Test if solver is compatible with LS interface */
  if ((LS->ops->gettype == NULL) || (LS->ops->solve == NULL))
  {
    KINProcessError(kin_mem, KINLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "LS object is missing a required operation");
    return (KINLS_ILL_INPUT);
  }

  /* Retrieve the LS type */
  LSType = SUNLinSolGetType(LS);

  /* Return with error if LS has 'matrix-embedded' type */
  if (LSType == SUNLINEARSOLVER_MATRIX_EMBEDDED)
  {
    KINProcessError(kin_mem, KINLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "KINSOL is incompatible with MATRIX_EMBEDDED LS objects");
    return (KINLS_ILL_INPUT);
  }

  /* Set flags based on LS type */
  iterative   = (LSType != SUNLINEARSOLVER_DIRECT);
  matrixbased = (LSType != SUNLINEARSOLVER_ITERATIVE);

  /* check for required vector operations for KINLS interface */
  if ((kin_mem->kin_vtemp1->ops->nvconst == NULL) ||
      (kin_mem->kin_vtemp1->ops->nvdotprod == NULL))
  {
    KINProcessError(kin_mem, KINLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_LS_BAD_NVECTOR);
    return (KINLS_ILL_INPUT);
  }

  /* Check for compatible LS type, matrix and "atimes" support */
  if (iterative)
  {
    if ((LS->ops->setscalingvectors == NULL) &&
        (kin_mem->kin_vtemp1->ops->nvgetlength == NULL))
    {
      KINProcessError(kin_mem, KINLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_LS_BAD_NVECTOR);
      return (KINLS_ILL_INPUT);
    }

    if (!matrixbased && (LS->ops->setatimes == NULL))
    {
      KINProcessError(kin_mem, KINLS_ILL_INPUT, __LINE__, __func__,
                      __FILE__, "Incompatible inputs: iterative LS must support ATimes routine");
      return (KINLS_ILL_INPUT);
    }

    if (matrixbased && A == NULL)
    {
      KINProcessError(kin_mem, KINLS_ILL_INPUT, __LINE__, __func__,
                      __FILE__, "Incompatible inputs: matrix-iterative LS requires non-NULL matrix");
      return (KINLS_ILL_INPUT);
    }
  }
  else if (A == NULL)
  {
    KINProcessError(kin_mem, KINLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Incompatible inputs: direct LS requires non-NULL matrix");
    return (KINLS_ILL_INPUT);
  }

  /* free any existing system solver attached to KIN */
  if (kin_mem->kin_lfree) { kin_mem->kin_lfree(kin_mem); }

  /* Determine if this is an iterative linear solver */
  kin_mem->kin_inexact_ls = iterative;

  /* Set four main system linear solver function fields in kin_mem */
  kin_mem->kin_linit  = kinLsInitialize;
  kin_mem->kin_lsetup = kinLsSetup;
  kin_mem->kin_lsolve = kinLsSolve;
  kin_mem->kin_lfree  = kinLsFree;

  /* Get memory for KINLsMemRec */
  kinls_mem = NULL;
  kinls_mem = (KINLsMem)malloc(sizeof(struct KINLsMemRec));
  if (kinls_mem == NULL)
  {
    KINProcessError(kin_mem, KINLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_LS_MEM_FAIL);
    return (KINLS_MEM_FAIL);
  }
  memset(kinls_mem, 0, sizeof(struct KINLsMemRec));

  /* set SUNLinearSolver pointer */
  kinls_mem->LS = LS;

  /* Set defaults for Jacobian-related fields */
  if (A != NULL)
  {
    kinls_mem->jacDQ  = SUNTRUE;
    kinls_mem->jac    = kinLsDQJac;
    kinls_mem->J_data = kin_mem;
  }
  else
  {
    kinls_mem->jacDQ  = SUNFALSE;
    kinls_mem->jac    = NULL;
    kinls_mem->J_data = NULL;
  }
  kinls_mem->jtimesDQ = SUNTRUE;
  kinls_mem->jtimes   = kinLsDQJtimes;
  kinls_mem->jt_func  = kin_mem->kin_func;
  kinls_mem->jt_data  = kin_mem;

  /* Set defaults for preconditioner-related fields */
  kinls_mem->pset   = NULL;
  kinls_mem->psolve = NULL;
  kinls_mem->pfree  = NULL;
  kinls_mem->pdata  = kin_mem->kin_user_data;

  /* Initialize counters */
  kinLsInitializeCounters(kinls_mem);

  /* Set default values for the rest of the LS parameters */
  kinls_mem->last_flag = KINLS_SUCCESS;

  /* If LS supports ATimes, attach KINLs routine */
  if (LS->ops->setatimes)
  {
    retval = SUNLinSolSetATimes(LS, kin_mem, kinLsATimes);
    if (retval != SUN_SUCCESS)
    {
      KINProcessError(kin_mem, KINLS_SUNLS_FAIL, __LINE__, __func__, __FILE__,
                      "Error in calling SUNLinSolSetATimes");
      free(kinls_mem);
      kinls_mem = NULL;
      return (KINLS_SUNLS_FAIL);
    }
  }

  /* If LS supports preconditioning, initialize pset/psol to NULL */
  if (LS->ops->setpreconditioner)
  {
    retval = SUNLinSolSetPreconditioner(LS, kin_mem, NULL, NULL);
    if (retval != SUN_SUCCESS)
    {
      KINProcessError(kin_mem, KINLS_SUNLS_FAIL, __LINE__, __func__, __FILE__,
                      "Error in calling SUNLinSolSetPreconditioner");
      free(kinls_mem);
      kinls_mem = NULL;
      return (KINLS_SUNLS_FAIL);
    }
  }

  /* initialize tolerance scaling factor */
  kinls_mem->tol_fac = -ONE;

  /* set SUNMatrix pointer (can be NULL) */
  kinls_mem->J = A;

  /* Attach linear solver memory to integrator memory */
  kin_mem->kin_lmem = kinls_mem;

  return (KINLS_SUCCESS);
}